

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O0

shared_ptr<KmerList> __thiscall
BatchKmersCounter::kmerCountOMPDiskBased
          (BatchKmersCounter *this,uint8_t K,LongReadsDatastore *reads,uint minCount,string *tmpdir,
          string *workdir,uchar disk_batches)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  ostream *poVar4;
  size_t sVar5;
  size_t sVar6;
  element_type *peVar7;
  undefined8 *puVar8;
  ulong uVar9;
  int *piVar10;
  KMerNodeFreq_s *pKVar11;
  char *__filename;
  void *pvVar12;
  uint uVar13;
  undefined1 *puVar14;
  size_t *psVar15;
  long lVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar18;
  undefined1 *this_00;
  shared_ptr<KmerList> sVar19;
  undefined1 auStack_fe8 [24];
  undefined1 *local_fd0;
  void *local_fc8;
  char *in_stack_fffffffffffff040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff048;
  undefined7 in_stack_fffffffffffff050;
  undefined1 in_stack_fffffffffffff057;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff058;
  undefined8 in_stack_fffffffffffff068;
  undefined1 *local_f00;
  int local_e64;
  string local_e60 [4];
  int i_4;
  undefined1 local_e40 [8];
  ofstream kff;
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [36];
  int local_bdc;
  uint local_bd8;
  int i_3;
  uint local_bd0;
  uint local_bcc;
  int i_2;
  uint min_1;
  size_t alloc_block;
  uint64_t *local_bb8;
  uint64_t *h;
  uint64_t *__end1;
  uint64_t *__begin1;
  uint64_t (*__range1) [256];
  uint64_t hist [256];
  long local_390;
  uint64_t not_used;
  uint64_t used;
  uint local_378;
  int i_1;
  uint min;
  bool first;
  KMerNodeFreq_s current_kmer;
  string local_340 [32];
  string local_320 [32];
  int local_300;
  uint local_2fc;
  int i;
  uint finished_files;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  string local_2d8 [48];
  string local_2a8 [32];
  string local_288 [32];
  char local_268 [8];
  ofstream batch_file;
  BatchKmersCounter local_68 [8];
  shared_ptr<KmerList> kmer_list;
  uint64_t from;
  uint64_t to;
  int batch;
  uint64_t total_kmers_in_batches;
  string *workdir_local;
  string *tmpdir_local;
  uint minCount_local;
  LongReadsDatastore *reads_local;
  uint8_t K_local;
  shared_ptr<KmerList> *kmerlist;
  
  poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff048 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff048 >> 0x18,0));
  poVar4 = std::operator<<(poVar4,"disk-based kmer counting with ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)disk_batches);
  poVar4 = std::operator<<(poVar4," batches");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (to._4_4_ = 0; to._4_4_ < (int)(uint)disk_batches; to._4_4_ = to._4_4_ + 1) {
    sVar5 = LongReadsDatastore::size((LongReadsDatastore *)0x488c81);
    sVar6 = LongReadsDatastore::size((LongReadsDatastore *)0x488cb7);
    kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (((long)to._4_4_ * sVar6) / (ulong)disk_batches);
    kmerCountOMP(local_68,K,reads,
                 (uint64_t)
                 kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,((long)(to._4_4_ + 1) * sVar5) / (ulong)disk_batches,0);
    std::operator+(in_stack_fffffffffffff048,in_stack_fffffffffffff040);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff068 >> 0x20));
    std::operator+(in_stack_fffffffffffff058,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff057,in_stack_fffffffffffff050));
    _Var3 = std::operator|(_S_out,_S_trunc);
    _Var3 = std::operator|(_Var3,_S_bin);
    std::ofstream::ofstream(local_268,local_288,_Var3);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string(local_2a8);
    peVar7 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x488dba);
    pKVar11 = peVar7->kmers;
    std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x488dd0);
    std::ostream::write(local_268,(long)pKVar11);
    std::ofstream::close();
    poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff048 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffff048 >> 0x18,0));
    poVar4 = std::operator<<(poVar4,"batch ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,to._4_4_);
    poVar4 = std::operator<<(poVar4," done and dumped with ");
    peVar7 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x488e6f);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,peVar7->size);
    poVar4 = std::operator<<(poVar4," kmers");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x488ec2);
    std::ofstream::~ofstream(local_268);
    std::shared_ptr<KmerList>::~shared_ptr((shared_ptr<KmerList> *)0x488ee3);
  }
  poVar4 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffff048 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffff048 >> 0x18,0));
  poVar4 = std::operator<<(poVar4,"merging from disk");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar18 = (ulong)disk_batches;
  __vla_expr0 = (unsigned_long)auStack_fe8;
  lVar16 = -(ulong)((uint)disk_batches * 0x200 + 0xf + (uint)disk_batches * 8 & 0xfffffff0);
  puVar14 = auStack_fe8 + lVar16;
  __vla_expr1 = uVar18;
  if (uVar18 != 0) {
    local_f00 = puVar14;
    do {
      *(undefined8 *)(&stack0xfffffffffffff010 + lVar16) = 0x48903b;
      std::ifstream::ifstream(local_f00);
      local_f00 = local_f00 + 0x208;
    } while (local_f00 != puVar14 + uVar18 * 0x208);
  }
  uVar13 = disk_batches + 0xf & 0xfffffff0;
  __vla_expr2 = (ulong)disk_batches;
  psVar15 = (size_t *)
            (puVar14 +
            (-(ulong)(disk_batches + 0xf + (uint)disk_batches * 0x10 & 0xfffffff0) - (ulong)uVar13))
  ;
  _i = (ulong)disk_batches;
  local_2fc = 0;
  for (local_300 = 0; local_300 < (int)(uint)disk_batches; local_300 = local_300 + 1) {
    lVar16 = (long)local_300;
    psVar15[-1] = 0x489112;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar15[6],
                   (char *)psVar15[5]);
    psVar15[-1] = 0x489126;
    std::__cxx11::to_string(*(int *)((long)psVar15 + 0x54));
    psVar15[-1] = 0x489142;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar15[8],
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar15[7]);
    psVar15[-1] = 0x489153;
    std::operator|(_S_in,_S_bin);
    psVar15[-1] = 0x489174;
    std::ifstream::open((string *)(puVar14 + lVar16 * 0x208),(_Ios_Openmode)local_320);
    psVar15[-1] = 0x489182;
    std::__cxx11::string::~string(local_320);
    psVar15[-1] = 0x48918e;
    std::__cxx11::string::~string((string *)((long)&current_kmer.kdata + 9));
    psVar15[-1] = 0x48919a;
    std::__cxx11::string::~string(local_340);
    lVar16 = (long)local_300;
    psVar15[-1] = 0x4891d4;
    std::istream::read(puVar14 + lVar16 * 0x208,(long)psVar15 + lVar16 * 0x11);
    puVar14[(long)local_300 - (ulong)uVar13] = 1;
  }
  i_1._2_1_ = 1;
  local_378 = 0;
  for (used._4_4_ = 1; (int)used._4_4_ < (int)(uint)disk_batches; used._4_4_ = used._4_4_ + 1) {
    if ((puVar14[(long)(int)used._4_4_ - (ulong)uVar13] & 1) != 0) {
      psVar15[-1] = 0x489350;
      bVar1 = KMerNodeFreq_s::operator<
                        ((KMerNodeFreq_s *)((long)psVar15 + (long)(int)used._4_4_ * 0x11),
                         (KMerNodeFreq_s *)((long)psVar15 + (ulong)local_378 * 0x11));
      if (bVar1) {
        local_378 = used._4_4_;
      }
    }
  }
  puVar8 = (undefined8 *)((long)psVar15 + (ulong)local_378 * 0x11);
  unique0x00012000 = *puVar8;
  current_kmer.kdata._0_8_ = puVar8[1];
  current_kmer.kdata._8_1_ = 0;
  not_used = 0;
  local_390 = 0;
  h = hist + 0xff;
  __begin1 = (uint64_t *)&__range1;
  for (__end1 = __begin1; __end1 != h; __end1 = __end1 + 1) {
    local_bb8 = __end1;
    *__end1 = 0;
  }
  alloc_block._7_1_ = 0;
  psVar15[-1] = 0x48945a;
  std::make_shared<KmerList>();
  _i_2 = 10000000;
  while (local_2fc < disk_batches) {
    local_bcc = 0;
    while (((puVar14[(ulong)local_bcc - (ulong)uVar13] ^ 0xff) & 1) != 0) {
      local_bcc = local_bcc + 1;
    }
    for (local_bd0 = 1; (int)local_bd0 < (int)(uint)disk_batches; local_bd0 = local_bd0 + 1) {
      if ((puVar14[(long)(int)local_bd0 - (ulong)uVar13] & 1) != 0) {
        lVar16 = (long)(int)local_bd0;
        uVar9 = (ulong)local_bcc;
        psVar15[-1] = 0x489512;
        bVar1 = KMerNodeFreq_s::operator<
                          ((KMerNodeFreq_s *)((long)psVar15 + lVar16 * 0x11),
                           (KMerNodeFreq_s *)((long)psVar15 + uVar9 * 0x11));
        if (bVar1) {
          local_bcc = local_bd0;
        }
      }
    }
    uVar9 = (ulong)local_bcc;
    psVar15[-1] = 0x489589;
    bVar1 = KMerNodeFreq_s::operator>
                      ((KMerNodeFreq_s *)((long)psVar15 + uVar9 * 0x11),
                       (KMerNodeFreq_s *)((long)&i_1 + 3));
    if (bVar1) {
      i_3 = 0xff;
      local_bd8 = (uint)current_kmer.kdata._8_1_;
      psVar15[-1] = 0x4895ca;
      piVar10 = std::min<int>(&i_3,(int *)&local_bd8);
      hist[(long)*piVar10 + -1] = hist[(long)*piVar10 + -1] + 1;
      if (current_kmer.kdata._8_1_ < minCount) {
        local_390 = local_390 + 1;
      }
      else {
        psVar15[-1] = 0x48961b;
        peVar7 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)psVar15[-1]);
        if (peVar7->size <= not_used) {
          psVar15[-1] = 0x489637;
          std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     psVar15[-1]);
          psVar15[-1] = 0x48964a;
          std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     psVar15[-1]);
          psVar15[-1] = 0x489664;
          KmerList::resize((KmerList *)psVar15[1],*psVar15);
        }
        psVar15[-1] = 0x489674;
        peVar7 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)psVar15[-1]);
        pKVar11 = peVar7->kmers + not_used;
        *(undefined8 *)&pKVar11->kdata = stack0xfffffffffffffc8f;
        *(undefined8 *)((long)&pKVar11->kdata + 8) = (undefined8)current_kmer.kdata;
        pKVar11->count = current_kmer.kdata._8_1_;
        not_used = not_used + 1;
      }
      puVar8 = (undefined8 *)((long)psVar15 + (ulong)local_bcc * 0x11);
      unique0x00012000 = *puVar8;
      current_kmer.kdata._0_8_ = puVar8[1];
      current_kmer.kdata._8_1_ = *(byte *)(puVar8 + 2);
    }
    else {
      uVar9 = (ulong)local_bcc;
      psVar15[-1] = 0x489720;
      KMerNodeFreq_s::combine
                ((KMerNodeFreq_s *)((long)&i_1 + 3),(KMerNodeFreq_s *)((long)psVar15 + uVar9 * 0x11)
                );
    }
    uVar9 = (ulong)local_bcc;
    psVar15[-1] = 0x48975d;
    std::istream::read(puVar14 + uVar9 * 0x208,(long)psVar15 + uVar9 * 0x11);
    psVar15[-1] = 0x48978f;
    bVar2 = std::ios::eof();
    if ((bVar2 & 1) != 0) {
      puVar14[(ulong)local_bcc - (ulong)uVar13] = 0;
      local_2fc = local_2fc + 1;
    }
  }
  hist[(long)(int)(uint)current_kmer.kdata._8_1_ + -1] =
       hist[(long)(int)(uint)current_kmer.kdata._8_1_ + -1] + 1;
  if (current_kmer.kdata._8_1_ < minCount) {
    local_390 = local_390 + 1;
  }
  else {
    psVar15[-1] = 0x48980f;
    peVar7 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        psVar15[-1]);
    if (peVar7->size <= not_used) {
      psVar15[-1] = 0x48982b;
      std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 psVar15[-1]);
      psVar15[-1] = 0x48983e;
      std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 psVar15[-1]);
      psVar15[-1] = 0x489858;
      KmerList::resize((KmerList *)psVar15[1],*psVar15);
    }
    psVar15[-1] = 0x489868;
    peVar7 = std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        psVar15[-1]);
    pKVar11 = peVar7->kmers + not_used;
    *(undefined8 *)&pKVar11->kdata = stack0xfffffffffffffc8f;
    *(undefined8 *)((long)&pKVar11->kdata + 8) = (undefined8)current_kmer.kdata;
    pKVar11->count = current_kmer.kdata._8_1_;
    not_used = not_used + 1;
  }
  psVar15[-1] = 0x4898c6;
  std::__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<KmerList,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)psVar15[-1])
  ;
  psVar15[-1] = 0x4898d5;
  KmerList::resize((KmerList *)psVar15[1],*psVar15);
  for (local_bdc = 0; local_bdc < (int)(uint)disk_batches; local_bdc = local_bdc + 1) {
    psVar15[-1] = 0x489914;
    std::ifstream::close();
    psVar15[-1] = 0x489930;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar15[6],
                   (char *)psVar15[5]);
    psVar15[-1] = 0x489944;
    std::__cxx11::to_string(*(int *)((long)psVar15 + 0x54));
    psVar15[-1] = 0x489960;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar15[8],
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar15[7]);
    psVar15[-1] = 0x48996e;
    __filename = (char *)std::__cxx11::string::c_str();
    psVar15[-1] = 0x489976;
    remove(__filename);
    psVar15[-1] = 0x489982;
    std::__cxx11::string::~string(local_c00);
    psVar15[-1] = 0x48998e;
    std::__cxx11::string::~string(local_c40);
    psVar15[-1] = 0x48999a;
    std::__cxx11::string::~string(local_c20);
  }
  psVar15[-1] = 0x4899fd;
  poVar4 = sdglib::OutputLog(*(LogLevels *)((long)psVar15 + 0x34),*(bool *)((long)psVar15 + 0x33));
  psVar15[-1] = 0x489a19;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,not_used);
  psVar15[-1] = 0x489a35;
  poVar4 = std::operator<<(poVar4,"/");
  psVar15[-1] = 0x489a5b;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,not_used + local_390);
  psVar15[-1] = 0x489a77;
  poVar4 = std::operator<<(poVar4," kmers with Freq >= ");
  psVar15[-1] = 0x489a8f;
  pvVar12 = (void *)std::ostream::operator<<(poVar4,minCount);
  psVar15[-1] = 0x489aab;
  std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
  psVar15[-1] = 0x489ac0;
  bVar1 = std::operator!=((char *)psVar15[1],
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          *psVar15);
  if (bVar1) {
    psVar15[-1] = 0x489af1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar15[6],
                   (char *)psVar15[5]);
    psVar15[-1] = 0x489b0b;
    std::ofstream::ofstream(local_e40,local_e60,_S_out);
    psVar15[-1] = 0x489b19;
    std::__cxx11::string::~string(local_e60);
    for (local_e64 = 1; local_e64 < 0x100; local_e64 = local_e64 + 1) {
      psVar15[-1] = 0x489b45;
      poVar4 = (ostream *)std::ostream::operator<<(local_e40,local_e64);
      psVar15[-1] = 0x489b61;
      poVar4 = std::operator<<(poVar4,", ");
      uVar9 = hist[(long)local_e64 + -1];
      psVar15[-1] = 0x489b85;
      pvVar12 = (void *)std::ostream::operator<<(poVar4,uVar9);
      local_fc8 = pvVar12;
      psVar15[-1] = 0x489ba1;
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
    }
    psVar15[-1] = 0x489c05;
    std::ofstream::close();
    psVar15[-1] = 0x489c13;
    std::ofstream::~ofstream(local_e40);
  }
  alloc_block._7_1_ = 1;
  alloc_block._7_1_ = 1;
  _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar18 * 0x208);
  local_fd0 = puVar14 + (long)_Var17._M_pi;
  while (puVar14 != local_fd0) {
    this_00 = local_fd0 + -0x208;
    auStack_fe8._16_8_ = this_00;
    psVar15[-1] = 0x489c80;
    std::ifstream::~ifstream(this_00);
    _Var17._M_pi = extraout_RDX;
    local_fd0 = (undefined1 *)auStack_fe8._16_8_;
  }
  sVar19.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var17._M_pi;
  sVar19.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<KmerList>)sVar19.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::kmerCountOMPDiskBased(uint8_t K, LongReadsDatastore const &reads,
                                         unsigned minCount, std::string tmpdir, std::string workdir,
                                         unsigned char disk_batches) {

    //If size larger than batch (or still not enough cpus used, or whatever), Lauch 2 tasks to sort the 2 halves, with minFreq=0

    sdglib::OutputLog() << "disk-based kmer counting with "<<(int) disk_batches<<" batches"<<std::endl;
    uint64_t total_kmers_in_batches=0;
    for (auto batch=0;batch < disk_batches;batch++) {
        uint64_t to = (batch+1) * reads.size()/disk_batches;
        uint64_t from= batch * reads.size()/disk_batches;
        auto kmer_list = kmerCountOMP(K, reads,from,to);
        std::ofstream batch_file(tmpdir+"/kmer_count_batch_"+std::to_string((int)batch),std::ios::out | std::ios::trunc | std::ios::binary);
        batch_file.write((const char *)kmer_list->kmers,sizeof(KMerNodeFreq_s)*kmer_list->size);
        batch_file.close();
        sdglib::OutputLog() << "batch "<<(int) batch<<" done and dumped with "<<kmer_list->size<< " kmers" <<std::endl;
        total_kmers_in_batches+=kmer_list->size;
    }

    //now a multi-merge sort between all batch files into the Dict
    sdglib::OutputLog() << "merging from disk"<<std::endl;
    //open all batch files
    std::ifstream dbf[disk_batches];
    bool dbf_active[disk_batches];
    KMerNodeFreq_s next_knf_from_dbf[disk_batches];
    uint finished_files=0;
    for (auto i=0;i<disk_batches;i++){
        dbf[i].open(tmpdir+"/kmer_count_batch_"+std::to_string((int)i),std::ios::in | std::ios::binary);
        dbf[i].read((char *)&next_knf_from_dbf[i],sizeof(KMerNodeFreq_s));
        dbf_active[i]=true;
    }
    //set all finished flags to false
    //TODO: stupid minimum search
    KMerNodeFreq_s current_kmer;
    //while finished_files<batches
    bool first=true;
    uint min=0;
    for (auto i=1;i<disk_batches;++i)
        if (dbf_active[i]){
            if (next_knf_from_dbf[i]<next_knf_from_dbf[min]) min=i;
        }
    current_kmer=next_knf_from_dbf[min];
    current_kmer.count=0;
    uint64_t used = 0,not_used=0;
    uint64_t hist[256];
    for (auto &h:hist) h=0;
    std::shared_ptr<KmerList> kmerlist=std::make_shared<KmerList>();
    //size_t last_kmer=0;
    size_t alloc_block=10000000;
    while (finished_files<disk_batches) {
        //find minimum of the non-finished files
        uint min=0;
        while (!dbf_active[min])++min;
        for (auto i=1;i<disk_batches;++i)
            if (dbf_active[i]){
                if (next_knf_from_dbf[i]<next_knf_from_dbf[min]) min=i;
            }
        //larger than current kmer?
        if (next_knf_from_dbf[min] > current_kmer) {
            ++hist[std::min(255,(int)current_kmer.count)];
            if (current_kmer.count>=minCount) {
                //(*dict)->insertEntryNoLocking(BRQ_Entry((BRQ_Kmer) current_kmer, current_kmer.kc));
                //kmerlist.push_back(current_kmer);
                if (used>=kmerlist->size) kmerlist->resize(kmerlist->size+alloc_block);
                kmerlist->kmers[used]=current_kmer;
                ++used;
            }
            else ++not_used;
            current_kmer=next_knf_from_dbf[min];
        } else {
            current_kmer.combine(next_knf_from_dbf[min]);
        }
        //advance min file
        dbf[min].read((char *)&next_knf_from_dbf[min],sizeof(KMerNodeFreq_s));
        if ( dbf[min].eof() ) {
            dbf_active[min]=false;
            ++finished_files;
        }
    }

    ++hist[(int)current_kmer.count];
    if (current_kmer.count>=minCount) {
        //kmerlist.push_back(current_kmer);
        if (used>=kmerlist->size) kmerlist->resize(kmerlist->size+alloc_block);
        kmerlist->kmers[used]=current_kmer;
        used++;
    }
    else not_used++;
    kmerlist->resize(used);
    for (auto i=0;i<disk_batches;i++) {
        dbf[i].close();
        std::remove((tmpdir + "/kmer_count_batch_" +std::to_string((int)i)).c_str());
    }
    sdglib::OutputLog()<< used << "/" << used+not_used << " kmers with Freq >= " << minCount << std::endl;
    if (""!=workdir) {
        std::ofstream kff(workdir + "/small_K.freqs");
        for (auto i = 1; i < 256; i++) kff << i << ", " << hist[i] << std::endl;
        kff.close();
    }
    return kmerlist;
}